

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O1

bov_window_t * bov_window_new(int width,int height,char *win_name)

{
  GLfloat *pGVar1;
  PFNGLUNIFORM1IPROC p_Var2;
  int iVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLuint GVar6;
  GLuint GVar7;
  GLuint GVar8;
  GLint GVar9;
  bov_window_t *window;
  GLFWmonitor *pGVar10;
  GLFWvidmode *pGVar11;
  GLFWwindow *handle;
  void *pvVar12;
  GLFWcursor *pGVar13;
  bov_text_t *pbVar14;
  uint uVar15;
  uchar (*pauVar16) [640];
  uchar *puVar17;
  int iVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  GLenum shaderType;
  long lVar22;
  undefined1 *puVar23;
  undefined1 *puVar24;
  double dVar25;
  double dVar26;
  int height_local;
  int width_local;
  GLuint local_1d8;
  GLuint local_1d4;
  GLuint local_1d0;
  GLuint local_1cc;
  void *local_1c8;
  ulong local_1c0;
  GLuint local_1b4;
  double cursorY;
  double cursorX;
  undefined4 local_19c;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 local_18c;
  undefined4 local_188;
  undefined4 local_184;
  undefined4 local_180;
  undefined4 local_17c;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  GLuint local_16c;
  GLchar *local_168;
  GLchar *local_160;
  GLchar *local_158;
  GLchar *local_150;
  GLchar *local_148;
  GLchar *local_140;
  GLchar *local_138;
  GLchar *local_130;
  GLchar *local_128;
  GLchar *local_120;
  GLubyte local_118 [37];
  GLubyte local_f3 [195];
  
  height_local = height;
  width_local = width;
  window = (bov_window_t *)malloc(0xc0);
  if (window == (bov_window_t *)0x0) {
LAB_00107094:
    bov_window_new_cold_4();
  }
  else {
    glfwSetErrorCallback(error_callback);
    iVar3 = glfwInit();
    if (iVar3 == 0) goto LAB_0010709e;
    glfwWindowHint(0x22002,3);
    glfwWindowHint(0x22003,2);
    glfwWindowHint(0x2100d,0);
    glfwWindowHint(0x22006,1);
    glfwWindowHint(0x22008,0x32001);
    if (height_local == 0 || width_local == 0) {
      pGVar10 = glfwGetPrimaryMonitor();
      pGVar11 = glfwGetVideoMode(pGVar10);
      window->size[0] = pGVar11->width;
      window->size[1] = pGVar11->height;
      iVar3 = pGVar11->width;
      iVar18 = pGVar11->height;
      pGVar10 = glfwGetPrimaryMonitor();
    }
    else {
      if (height_local < 0) {
        glfwWindowHint(0x20003,0);
        height_local = -height_local;
      }
      if (width_local < 0) {
        glfwWindowHint(0x20008,1);
        width_local = 100;
        height_local = 100;
      }
      window->size[0] = width_local;
      window->size[1] = height_local;
      pGVar10 = (GLFWmonitor *)0x0;
      iVar3 = width_local;
      iVar18 = height_local;
    }
    handle = glfwCreateWindow(iVar3,iVar18,win_name,pGVar10,(GLFWwindow *)0x0);
    window->self = handle;
    if (handle != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(handle);
      glfwSetWindowUserPointer(window->self,window);
      iVar3 = gladLoadGLLoader(glfwGetProcAddress);
      if (iVar3 == 0) {
        bov_window_new_cold_1();
      }
      (window->param).zoom = 1.0;
      glfwGetFramebufferSize(window->self,&width_local,&height_local);
      iVar18 = width_local;
      iVar3 = height_local;
      pvVar12 = glfwGetWindowUserPointer(window->self);
      *(float *)((long)pvVar12 + 0x10) = (float)iVar18;
      *(float *)((long)pvVar12 + 0x14) = (float)iVar3;
      (*glad_glViewport)(0,0,iVar18,iVar3);
      (window->param).translate[0] = 0.0;
      (window->param).translate[1] = 0.0;
      window->wtime = 2.2250738585072014e-308;
      window->backgroundColor[0] = 1.0;
      window->backgroundColor[1] = 1.0;
      window->backgroundColor[2] = 1.0;
      window->backgroundColor[3] = 0.0;
      glfwSetKeyCallback(window->self,key_callback);
      glfwSetFramebufferSizeCallback(window->self,framebuffer_size_callback);
      glfwSetWindowSizeCallback(window->self,window_size_callback);
      glfwSetMouseButtonCallback(window->self,mouse_button_callback);
      glfwSetCursorPosCallback(window->self,cursor_pos_callback);
      glfwSetScrollCallback(window->self,scroll_callback);
      glfwSwapInterval(1);
      (*glad_glClearColor)
                (window->backgroundColor[0],window->backgroundColor[1],window->backgroundColor[2],
                 window->backgroundColor[3]);
      (*glad_glEnable)(0x809d);
      (*glad_glEnable)(0xb44);
      (*glad_glEnable)(0xbe2);
      (*glad_glBlendFunc)(0x302,0x303);
      (*glad_glPointSize)(5.0);
      (*glad_glEnable)(0xb20);
      glfwSetTime(2.2250738585072014e-308);
      cursorX = 0.0;
      cursorY = 0.0;
      glfwGetCursorPos(window->self,&cursorX,&cursorY);
      window->cursorPos[0] = (cursorX + cursorX) / (double)window->size[0] + -1.0;
      dVar26 = 1.0 - cursorY / (double)window->size[1];
      window->cursorPos[1] = dVar26 + dVar26 + -1.0;
      window->clickTime[0] = 0.0;
      window->clickTime[1] = 0.0;
      window->counter = 0;
      window->running = 1;
      window->help_needed = 0;
      window->indication_needed = 0;
      pGVar13 = glfwCreateStandardCursor(0x36005);
      window->leftClickCursor = pGVar13;
      (*glad_glGenBuffers)(2,window->ubo);
      (*glad_glBindBuffer)(0x8a11,window->ubo[0]);
      (*glad_glBufferData)(0x8a11,0x14,(void *)0x0,0x88e4);
      (*glad_glBindBufferRange)(0x8a11,0,window->ubo[0],0,0x14);
      (*glad_glBindBuffer)(0x8a11,window->ubo[1]);
      (*glad_glBufferData)(0x8a11,0x40,(void *)0x0,0x88e8);
      shaderType = 0x40;
      (*glad_glBindBufferRange)(0x8a11,1,window->ubo[1],0,0x40);
      (*glad_glBindBuffer)(0x8a11,0);
      cursorX = (double)text_vert;
      local_170 = 0xa42;
      GVar4 = LoadShader((GLsizei)&cursorX,(GLchar **)&local_170,(GLint *)"text_vert.glsl",
                         (char *)0x8b31,shaderType);
      if (GVar4 != 0) {
        cursorY = (double)text_frag;
        local_174 = 0xa1c;
        GVar5 = LoadShader((GLsizei)&cursorY,(GLchar **)&local_174,(GLint *)"text_frag.glsl",
                           (char *)0x8b30,shaderType);
        if (GVar5 != 0) {
          GVar6 = (*glad_glCreateProgram)();
          window->program[0] = GVar6;
          (*glad_glBindAttribLocation)(GVar6,0,"pos");
          (*glad_glBindAttribLocation)(window->program[0],1,"tex");
          GVar6 = GVar5;
          iVar3 = program_init(window,0,2,(ulong)GVar4);
          if (iVar3 == 0) {
            (*glad_glDetachShader)(window->program[0],GVar4);
            (*glad_glDetachShader)(window->program[0],GVar5);
            (*glad_glDeleteShader)(GVar4);
            (*glad_glDeleteShader)(GVar5);
            local_120 = points_vert;
            local_178 = 0x51;
            GVar4 = LoadShader((GLsizei)&local_120,(GLchar **)&local_178,(GLint *)"points_vert.glsl"
                               ,(char *)0x8b31,GVar6);
            if (GVar4 != 0) {
              local_128 = points_geom;
              local_17c = 0xd11;
              GVar5 = LoadShader((GLsizei)&local_128,(GLchar **)&local_17c,
                                 (GLint *)"points_geom.glsl",(char *)0x8dd9,GVar6);
              if (GVar5 != 0) {
                local_130 = lines_geom;
                local_180 = 0xd7f;
                GVar7 = LoadShader((GLsizei)&local_130,(GLchar **)&local_180,
                                   (GLint *)"lines_geom.glsl",(char *)0x8dd9,GVar6);
                if (GVar7 != 0) {
                  local_138 = curve_geom;
                  local_184 = 0x1672;
                  GVar8 = LoadShader((GLsizei)&local_138,(GLchar **)&local_184,
                                     (GLint *)"curve_geom.glsl",(char *)0x8dd9,GVar6);
                  local_1c8 = (void *)CONCAT44(local_1c8._4_4_,GVar8);
                  if (GVar8 != 0) {
                    local_140 = triangles_geom;
                    local_188 = 0xf87;
                    local_1cc = LoadShader((GLsizei)&local_140,(GLchar **)&local_188,
                                           (GLint *)"triangles_geom.glsl",(char *)0x8dd9,GVar6);
                    if (local_1cc != 0) {
                      local_148 = points_frag;
                      local_18c = 0x101d;
                      GVar8 = LoadShader((GLsizei)&local_148,(GLchar **)&local_18c,
                                         (GLint *)"points_frag.glsl",(char *)0x8b30,GVar6);
                      local_1c0 = CONCAT44(local_1c0._4_4_,GVar8);
                      if (GVar8 != 0) {
                        local_150 = lines_frag;
                        local_190 = 0x7ff;
                        GVar8 = LoadShader((GLsizei)&local_150,(GLchar **)&local_190,
                                           (GLint *)"lines_frag.glsl",(char *)0x8b30,GVar6);
                        if (GVar8 != 0) {
                          local_158 = triangles_frag;
                          local_194 = 0x74c;
                          local_1d0 = LoadShader((GLsizei)&local_158,(GLchar **)&local_194,
                                                 (GLint *)"triangles_frag.glsl",(char *)0x8b30,GVar6
                                                );
                          if (local_1d0 != 0) {
                            local_160 = default_vert;
                            local_198 = 0x8cf;
                            local_1d4 = LoadShader((GLsizei)&local_160,(GLchar **)&local_198,
                                                   (GLint *)"default_vert.glsl",(char *)0x8b31,GVar6
                                                  );
                            if (local_1d4 != 0) {
                              local_168 = default_frag;
                              local_19c = 0x646;
                              local_1d8 = LoadShader((GLsizei)&local_168,(GLchar **)&local_19c,
                                                     (GLint *)"default_frag.glsl",(char *)0x8b30,
                                                     GVar6);
                              if (local_1d8 != 0) {
                                GVar6 = (*glad_glCreateProgram)();
                                window->program[1] = GVar6;
                                GVar6 = (*glad_glCreateProgram)();
                                window->program[2] = GVar6;
                                GVar6 = (*glad_glCreateProgram)();
                                window->program[3] = GVar6;
                                GVar6 = (*glad_glCreateProgram)();
                                window->program[4] = GVar6;
                                GVar6 = (*glad_glCreateProgram)();
                                window->program[5] = GVar6;
                                local_1b4 = GVar4;
                                (*glad_glBindAttribLocation)(window->program[1],0,"pos");
                                (*glad_glBindAttribLocation)(window->program[2],0,"pos");
                                (*glad_glBindAttribLocation)(window->program[3],0,"pos");
                                (*glad_glBindAttribLocation)(window->program[4],0,"pos");
                                (*glad_glBindAttribLocation)(window->program[5],0,"pos");
                                GVar4 = local_1b4;
                                iVar3 = program_init(window,1,3,(ulong)local_1b4,(ulong)GVar5,
                                                     local_1c0 & 0xffffffff);
                                if (iVar3 == 0) {
                                  (*glad_glDetachShader)(window->program[1],GVar4);
                                  (*glad_glDetachShader)(window->program[1],GVar5);
                                  GVar6 = (GLuint)local_1c0;
                                  (*glad_glDetachShader)(window->program[1],(GLuint)local_1c0);
                                  (*glad_glDeleteShader)(GVar5);
                                  (*glad_glDeleteShader)(GVar6);
                                  iVar3 = program_init(window,2,3,(ulong)GVar4,(ulong)GVar7,
                                                       (ulong)GVar8);
                                  if (iVar3 == 0) {
                                    (*glad_glDetachShader)(window->program[2],GVar4);
                                    (*glad_glDetachShader)(window->program[2],GVar7);
                                    (*glad_glDetachShader)(window->program[2],GVar8);
                                    (*glad_glDeleteShader)(GVar7);
                                    iVar3 = program_init(window,3,3,(ulong)GVar4,
                                                         (ulong)local_1c8 & 0xffffffff,(ulong)GVar8)
                                    ;
                                    if (iVar3 == 0) {
                                      (*glad_glDetachShader)(window->program[3],GVar4);
                                      GVar5 = (GLuint)local_1c8;
                                      (*glad_glDetachShader)(window->program[3],(GLuint)local_1c8);
                                      (*glad_glDetachShader)(window->program[3],GVar8);
                                      (*glad_glDeleteShader)(GVar5);
                                      (*glad_glDeleteShader)(GVar8);
                                      iVar3 = program_init(window,4,3,(ulong)GVar4,(ulong)local_1cc)
                                      ;
                                      if (iVar3 == 0) {
                                        (*glad_glDetachShader)(window->program[4],GVar4);
                                        GVar6 = local_1cc;
                                        (*glad_glDetachShader)(window->program[4],local_1cc);
                                        GVar5 = local_1d0;
                                        (*glad_glDetachShader)(window->program[4],local_1d0);
                                        (*glad_glDeleteShader)(GVar4);
                                        (*glad_glDeleteShader)(GVar6);
                                        (*glad_glDeleteShader)(GVar5);
                                        iVar3 = program_init(window,5,2,(ulong)local_1d4,
                                                             (ulong)local_1d8);
                                        GVar4 = local_1d4;
                                        if (iVar3 == 0) {
                                          (*glad_glDetachShader)(window->program[5],local_1d4);
                                          GVar5 = local_1d8;
                                          uVar21 = (ulong)local_1d8;
                                          (*glad_glDetachShader)(window->program[5],local_1d8);
                                          (*glad_glDeleteShader)(GVar4);
                                          (*glad_glDeleteShader)(GVar5);
                                          iVar3 = 0x12c000;
                                          pvVar12 = malloc(0x12c000);
                                          if (pvVar12 != (void *)0x0) {
                                            puVar23 = (undefined1 *)((long)pvVar12 + 0x785);
                                            local_1c0 = 1;
                                            lVar22 = 0x11d6ea;
                                            local_1c8 = pvVar12;
                                            do {
                                              local_1c0 = local_1c0 + 1;
                                              lVar19 = -0x27e;
                                              puVar24 = puVar23;
                                              do {
                                                iVar3 = (uint)*(byte *)(lVar22 + -0x284 + lVar19) -
                                                        (uint)*(byte *)(lVar22 + 0x27e + lVar19);
                                                uVar20 = (uint)*(byte *)(lVar22 + 0x27c + lVar19);
                                                uVar15 = (uint)*(byte *)(lVar22 + -0x282 + lVar19);
                                                iVar18 = ((uVar20 - uVar15) + iVar3) * 0x2f +
                                                         ((uint)*(byte *)(lVar22 + -4 + lVar19) -
                                                         (uint)*(byte *)(lVar22 + -2 + lVar19)) *
                                                         0xa2;
                                                iVar3 = ((uVar15 - uVar20) + iVar3) * 0x2f +
                                                        ((uint)*(byte *)(lVar22 + -0x283 + lVar19) -
                                                        (uint)*(byte *)(lVar22 + 0x27d + lVar19)) *
                                                        0xa2;
                                                puVar24[-2] = *(undefined1 *)(lVar22 + -3 + lVar19);
                                                dVar26 = (double)(iVar3 * iVar3 + iVar18 * iVar18);
                                                if (dVar26 < 0.0) {
                                                  dVar26 = sqrt(dVar26);
                                                }
                                                else {
                                                  dVar26 = SQRT(dVar26);
                                                }
                                                pvVar12 = local_1c8;
                                                dVar25 = ((double)iVar18 / dVar26) * 128.0 + 128.0;
                                                if (dVar25 <= 0.0) {
                                                  dVar25 = 0.0;
                                                }
                                                if (255.9 <= dVar25) {
                                                  dVar25 = 255.9;
                                                }
                                                dVar26 = ((double)iVar3 / dVar26) * 128.0 + 128.0;
                                                if (dVar26 <= 0.0) {
                                                  dVar26 = 0.0;
                                                }
                                                if (255.9 <= dVar26) {
                                                  dVar26 = 255.9;
                                                }
                                                puVar24[-1] = (char)(int)dVar25;
                                                *puVar24 = (char)(int)dVar26;
                                                puVar24 = puVar24 + 3;
                                                lVar19 = lVar19 + 1;
                                              } while (lVar19 != 0);
                                              puVar23 = puVar23 + 0x780;
                                              lVar22 = lVar22 + 0x280;
                                            } while (local_1c0 != 0x27f);
                                            lVar22 = 2;
                                            pauVar16 = font.tex_data;
                                            do {
                                              *(uchar *)((long)local_1c8 + lVar22 + -2) =
                                                   (*pauVar16)[0];
                                              *(undefined2 *)((long)local_1c8 + lVar22 + -1) = 0;
                                              lVar22 = lVar22 + 0x780;
                                              pauVar16 = pauVar16 + 1;
                                            } while (lVar22 != 0x12c002);
                                            lVar22 = 0x77f;
                                            puVar17 = font.tex_data[0] + 0x27f;
                                            do {
                                              *(uchar *)((long)local_1c8 + lVar22 + -2) = *puVar17;
                                              *(undefined2 *)((long)local_1c8 + lVar22 + -1) = 0;
                                              lVar22 = lVar22 + 0x780;
                                              puVar17 = puVar17 + 0x280;
                                            } while (lVar22 != 0x12c77f);
                                            lVar22 = 5;
                                            puVar17 = font.tex_data[0];
                                            do {
                                              puVar17 = puVar17 + 1;
                                              *(uchar *)((long)local_1c8 + lVar22 + -2) = *puVar17;
                                              *(undefined2 *)((long)local_1c8 + lVar22 + -1) = 0;
                                              lVar22 = lVar22 + 3;
                                            } while (lVar22 != 0x77f);
                                            lVar22 = 0x12b885;
                                            puVar17 = font.tex_data[0x27f];
                                            do {
                                              puVar17 = puVar17 + 1;
                                              *(uchar *)((long)local_1c8 + lVar22 + -2) = *puVar17;
                                              *(undefined2 *)((long)local_1c8 + lVar22 + -1) = 0;
                                              lVar22 = lVar22 + 3;
                                            } while (lVar22 != 0x12bfff);
                                            (*glad_glActiveTexture)(0x84c0);
                                            (*glad_glGenTextures)(1,&local_16c);
                                            (*glad_glBindTexture)(0xde1,local_16c);
                                            (*glad_glTexImage2D)
                                                      (0xde1,0,0x1907,0x280,0x280,0,0x1907,0x1401,
                                                       pvVar12);
                                            (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
                                            (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
                                            (*glad_glTexParameteri)(0xde1,0x2802,0x812f);
                                            (*glad_glTexParameteri)(0xde1,0x2803,0x812f);
                                            window->font_atlas_texture = local_16c;
                                            free(pvVar12);
                                            GVar4 = window->program[0];
                                            (*glad_glUseProgram)(GVar4);
                                            GVar5 = (*glad_glGetUniformBlockIndex)
                                                              (GVar4,"worldBlock");
                                            GVar6 = (*glad_glGetUniformBlockIndex)
                                                              (GVar4,"objectBlock");
                                            (*glad_glUniformBlockBinding)(GVar4,GVar5,0);
                                            (*glad_glUniformBlockBinding)(GVar4,GVar6,1);
                                            p_Var2 = glad_glUniform1i;
                                            GVar9 = (*glad_glGetUniformLocation)(GVar4,"fontTex");
                                            (*p_Var2)(GVar9,0);
                                            GVar4 = window->program[1];
                                            (*glad_glUseProgram)(GVar4);
                                            GVar5 = (*glad_glGetUniformBlockIndex)
                                                              (GVar4,"worldBlock");
                                            GVar6 = (*glad_glGetUniformBlockIndex)
                                                              (GVar4,"objectBlock");
                                            (*glad_glUniformBlockBinding)(GVar4,GVar5,0);
                                            (*glad_glUniformBlockBinding)(GVar4,GVar6,1);
                                            GVar4 = window->program[3];
                                            (*glad_glUseProgram)(GVar4);
                                            GVar5 = (*glad_glGetUniformBlockIndex)
                                                              (GVar4,"worldBlock");
                                            GVar6 = (*glad_glGetUniformBlockIndex)
                                                              (GVar4,"objectBlock");
                                            (*glad_glUniformBlockBinding)(GVar4,GVar5,0);
                                            (*glad_glUniformBlockBinding)(GVar4,GVar6,1);
                                            GVar4 = window->program[4];
                                            (*glad_glUseProgram)(GVar4);
                                            GVar5 = (*glad_glGetUniformBlockIndex)
                                                              (GVar4,"worldBlock");
                                            GVar6 = (*glad_glGetUniformBlockIndex)
                                                              (GVar4,"objectBlock");
                                            (*glad_glUniformBlockBinding)(GVar4,GVar5,0);
                                            (*glad_glUniformBlockBinding)(GVar4,GVar6,1);
                                            GVar4 = window->program[2];
                                            (*glad_glUseProgram)(GVar4);
                                            GVar5 = (*glad_glGetUniformBlockIndex)
                                                              (GVar4,"worldBlock");
                                            GVar6 = (*glad_glGetUniformBlockIndex)
                                                              (GVar4,"objectBlock");
                                            (*glad_glUniformBlockBinding)(GVar4,GVar5,0);
                                            (*glad_glUniformBlockBinding)(GVar4,GVar6,1);
                                            GVar4 = window->program[5];
                                            (*glad_glUseProgram)(GVar4);
                                            GVar5 = (*glad_glGetUniformBlockIndex)
                                                              (GVar4,"worldBlock");
                                            GVar6 = (*glad_glGetUniformBlockIndex)
                                                              (GVar4,"objectBlock");
                                            (*glad_glUniformBlockBinding)(GVar4,GVar5,0);
                                            (*glad_glUniformBlockBinding)(GVar4,GVar6,1);
                                            window->last_program = 5;
                                            memcpy(local_f3,
                                                  " Keyboard shortcuts:\n -------------------\n\n   [esc]   exit\n  [space]  play/pause\n     p     save .ppm screenshot\n     r     reset zoom and translation\n    h k    display/hide keyboard shortcuts\n"
                                                  ,0xc3);
                                            pbVar14 = bov_text_new(local_f3,0x88e4);
                                            window->help = pbVar14;
                                            if ((pbVar14->param).spaceType != PIXEL_SPACE) {
                                              pGVar1 = (pbVar14->param).pos;
                                              if (*pGVar1 <= 5.0 && *pGVar1 != 5.0) {
                                                (pbVar14->param).pos[0] = 5.0;
                                              }
                                              pGVar1 = (pbVar14->param).pos + 1;
                                              if (*pGVar1 <= 5.0 && *pGVar1 != 5.0) {
                                                (pbVar14->param).pos[1] = 5.0;
                                              }
                                              pGVar1 = &(pbVar14->param).fontSize;
                                              if (*pGVar1 <= 32.0 && *pGVar1 != 32.0) {
                                                (pbVar14->param).fontSize = 32.0;
                                              }
                                            }
                                            (pbVar14->param).spaceType = PIXEL_SPACE;
                                            (pbVar14->param).fontSize = 32.0;
                                            (pbVar14->param).pos[0] = 16.0;
                                            (pbVar14->param).pos[1] = 288.0;
                                            (pbVar14->param).boldness = 0.1;
                                            (pbVar14->param).outlineWidth = 0.5;
                                            builtin_memcpy(local_118,
                                                           "press \'k\' for keyboard shortcuts\n",
                                                           0x22);
                                            pbVar14 = bov_text_new(local_118,0x88e4);
                                            window->indication = pbVar14;
                                            if ((pbVar14->param).spaceType != PIXEL_SPACE) {
                                              pGVar1 = (pbVar14->param).pos;
                                              if (*pGVar1 <= 5.0 && *pGVar1 != 5.0) {
                                                (pbVar14->param).pos[0] = 5.0;
                                              }
                                              pGVar1 = (pbVar14->param).pos + 1;
                                              if (*pGVar1 <= 5.0 && *pGVar1 != 5.0) {
                                                (pbVar14->param).pos[1] = 5.0;
                                              }
                                              pGVar1 = &(pbVar14->param).fontSize;
                                              if (*pGVar1 <= 32.0 && *pGVar1 != 32.0) {
                                                (pbVar14->param).fontSize = 32.0;
                                              }
                                            }
                                            (pbVar14->param).spaceType = PIXEL_SPACE;
                                            (pbVar14->param).fontSize = 32.0;
                                            (pbVar14->param).pos[0] = 16.0;
                                            (pbVar14->param).pos[1] = 16.0;
                                            (pbVar14->param).boldness = 0.1;
                                            (pbVar14->param).outlineWidth = 0.5;
                                            return window;
                                          }
                                          bov_window_new_cold_2();
                                          bov_error_log(iVar3,"%s",uVar21);
                                          fprintf(_stderr,"\t(in function %s, line %d)\n",
                                                  "error_callback",0x1ac);
                                          exit(1);
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      bov_window_new_cold_3();
      goto LAB_00107094;
    }
  }
  glfwTerminate();
LAB_0010709e:
  exit(1);
}

Assistant:

bov_window_t* bov_window_new(int width, int height, const char* win_name)
{
	bov_window_t* window = malloc(sizeof(bov_window_t));
	CHECK_MALLOC(window);

	glfwSetErrorCallback(error_callback);

	if(!glfwInit())
		exit(EXIT_FAILURE);

	glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
	glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 2);
	glfwWindowHint(GLFW_SAMPLES, 0); // we disable multisampling has we already use shader antialiasing
	glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
	glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

	if(width==0 || height==0) {
		const GLFWvidmode* mode = glfwGetVideoMode(glfwGetPrimaryMonitor());
		window->size[0] = mode->width;
		window->size[1] = mode->height;
		window->self = glfwCreateWindow(mode->width, mode->height, win_name,
		                                glfwGetPrimaryMonitor(), // fullscreen
		                                NULL);
	}
	else {
		if(height<0) {
			glfwWindowHint(GLFW_RESIZABLE, GL_FALSE);
			height = -height;
		}

		if(width<0) {
			glfwWindowHint(GLFW_MAXIMIZED, GLFW_TRUE);
			width = 100;
			height = 100;
		}
		window->size[0] = width;


		window->size[1] = height;

		window->self = glfwCreateWindow(width, height, win_name, NULL, NULL);
	}

	if(!window->self) {
		glfwTerminate();
		exit(EXIT_FAILURE);
	}

	glfwMakeContextCurrent(window->self);
	glfwSetWindowUserPointer(window->self,window);

	// load opengl functions with GLAD
	if(!gladLoadGLLoader((GLADloadproc) glfwGetProcAddress))
		BOV_ERROR_LOG(BOV_GLAD_ERROR,
		              "Failed to initialize OpenGL context");

	window->param.zoom = 1.0;
	glfwGetFramebufferSize(window->self, &width, &height);
	framebuffer_size_callback(window->self, width, height);
	window->param.translate[0] = window->param.translate[1] = 0.0;
	window->wtime = DBL_MIN;

	// white background color
	window->backgroundColor[0] = 1.0;
	window->backgroundColor[1] = 1.0;
	window->backgroundColor[2] = 1.0;
	window->backgroundColor[3] = 0.0;

	// glfwSetWindowCloseCallback(window->self,close_callback);
	glfwSetKeyCallback(window->self, key_callback);
	glfwSetFramebufferSizeCallback(window->self, framebuffer_size_callback);
	glfwSetWindowSizeCallback(window->self, window_size_callback);
	glfwSetMouseButtonCallback(window->self, mouse_button_callback);
	glfwSetCursorPosCallback(window->self, cursor_pos_callback);
	glfwSetScrollCallback(window->self, scroll_callback);

	//glfwSetInputMode(window->self,GLFW_CURSOR,GLFW_CURSOR_HIDDEN);


	glfwSwapInterval(1); // vsync
	glClearColor(window->backgroundColor[0],
	             window->backgroundColor[1],
	             window->backgroundColor[2],
	             window->backgroundColor[3]);
	glEnable(GL_MULTISAMPLE);
	glEnable(GL_CULL_FACE); // cull face that are not counterclockwise
	glEnable( GL_BLEND );
	glBlendFunc( GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA );

	glPointSize(5); // 10 pixels for a point
	glEnable( GL_LINE_SMOOTH );

	glfwSetTime(DBL_MIN); // set the time to 0

	{
		double cursorX = 0.0, cursorY = 0.0;
		glfwGetCursorPos(window->self, &cursorX, &cursorY);
		window->cursorPos[0] = 2.0 * cursorX / window->size[0] - 1.0;
		window->cursorPos[1] = 2.0 * (1.0 - cursorY / window->size[1]) - 1.0;
		window->clickTime[0] = 0.0;
		window->clickTime[1] = 0.0;
	}

	window->counter = 0;
	window->running = 1;
	window->help_needed = 0;
	window->indication_needed = 0;
	window->leftClickCursor = glfwCreateStandardCursor(GLFW_HRESIZE_CURSOR);

	window_OpenGL_init(window);

	window->help = bov_text_new((GLubyte[]) {
		" Keyboard shortcuts:\n"
		" -------------------\n\n"
		"   [esc]   exit\n"
		"  [space]  play/pause\n"
		"     p     save .ppm screenshot\n"
		"     r     reset zoom and translation\n"
		"    h k    display/hide keyboard shortcuts\n"
	}, GL_STATIC_DRAW);
	bov_text_set_space_type(window->help, PIXEL_SPACE);
	bov_text_set_fontsize(window->help, 32.0f); // 32 pixel height
	bov_text_set_pos(window->help, (GLfloat[2]){16.0f, 7.0f * 32.0f + 64.0f});
	bov_text_set_boldness(window->help, 0.1f);
	bov_text_set_outline_width(window->help, 0.5f);

	window->indication = bov_text_new((GLubyte[]) {
		"press 'k' for keyboard shortcuts\n"
	}, GL_STATIC_DRAW);
	bov_text_set_space_type(window->indication, PIXEL_SPACE);
	bov_text_set_fontsize(window->indication, 32.0f); // 32 pixel height
	bov_text_set_pos(window->indication, (GLfloat[2]){16.0f, 16.0f});
	bov_text_set_boldness(window->indication, 0.1f);
	bov_text_set_outline_width(window->indication, 0.5f);

	return window;
}